

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void align_text_image_cb(Fl_Choice *i,void *v)

{
  uint uVar1;
  uint uVar2;
  Fl_Menu_Item *pFVar3;
  Fl_Widget_Type *this;
  bool bVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar8;
  Fl_Menu_Item *pFVar9;
  
  if ((char *)v == "LOAD") {
    iVar5 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar5 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    uVar1 = (current_widget->o->label_).align_;
    for (pFVar9 = (i->super_Fl_Menu_).menu_; pFVar9->text != (char *)0x0; pFVar9 = pFVar9 + 1) {
      if ((uVar1 & 800) == *(uint *)&pFVar9->user_data_) {
        Fl_Choice::value(i,pFVar9);
      }
    }
  }
  else {
    pFVar9 = (i->super_Fl_Menu_).menu_;
    pFVar3 = (i->super_Fl_Menu_).value_;
    if (pFVar3 == (Fl_Menu_Item *)0x0) {
      lVar6 = -1;
    }
    else {
      lVar6 = (long)(int)(((long)pFVar3 - (long)pFVar9) / 0x38);
    }
    uVar1 = *(uint *)&pFVar9[lVar6].user_data_;
    bVar4 = false;
    ppFVar8 = &Fl_Type::first;
    while (this = (Fl_Widget_Type *)*ppFVar8, this != (Fl_Widget_Type *)0x0) {
      if ((this->super_Fl_Type).selected != '\0') {
        iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
        if (iVar5 != 0) {
          uVar2 = (this->o->label_).align_;
          uVar7 = uVar2 & 0xfffffcdf | uVar1;
          if (uVar2 != uVar7) {
            (this->o->label_).align_ = uVar7;
            Fl_Widget_Type::redraw(this);
            bVar4 = true;
          }
        }
      }
      ppFVar8 = &(this->super_Fl_Type).next;
    }
    if (bVar4) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void align_text_image_cb(Fl_Choice *i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    Fl_Menu_Item *mi = (Fl_Menu_Item*)i->menu();
    Fl_Align b = current_widget->o->align() & FL_ALIGN_IMAGE_MASK;
    for (;mi->text;mi++) {
      if ((Fl_Align)(mi->argument())==b)
        i->value(mi);
    }
  } else {
    const Fl_Menu_Item *mi = i->menu() + i->value();
    Fl_Align b = Fl_Align(fl_uintptr_t(mi->user_data()));
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	Fl_Align x = q->o->align();
	Fl_Align y = (x & ~FL_ALIGN_IMAGE_MASK) | b;
	if (x != y) {
          q->o->align(y);
	  q->redraw();
	  mod = 1;
	}
      }
    }
    if (mod) set_modflag(1);
  }
}